

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filter.cpp
# Opt level: O1

vector<double,_std::allocator<double>_> * __thiscall
rtb::Filter::Filter<double>::pass
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,Filter<double> *this,
          vector<double,_std::allocator<double>_> *values)

{
  double *pdVar1;
  iterator __position;
  double *pdVar2;
  double local_30;
  
  resetState(this);
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pdVar2 = (values->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar1 = (values->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar2 != pdVar1) {
    do {
      local_30 = filter(this,*pdVar2);
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (__return_storage_ptr__,__position,&local_30);
      }
      else {
        *__position._M_current = local_30;
        (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      pdVar2 = pdVar2 + 1;
    } while (pdVar2 != pdVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> Filter<T>::pass(const std::vector<T>& values) {
            resetState();
            std::vector<T> filteredValues;
            for (auto val : values)
                filteredValues.push_back(filter(val));
            return filteredValues;
        }